

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  iVar1 = std::uncaught_exceptions();
  if (iVar1 < 1) {
    if (this->m_captured !=
        ((long)(this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) {
      __assert_fail("m_captured == m_messages.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mariusbancila[P]stduuid/catch/catch.hpp"
                    ,0x2e90,"Catch::Capturer::~Capturer()");
    }
    if (this->m_captured != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        (*this->m_resultCapture->_vptr_IResultCapture[7])
                  (this->m_resultCapture,
                   (long)&(((this->m_messages).
                            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start)->macroName).m_start + lVar2);
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x48;
      } while (uVar3 < this->m_captured);
    }
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  return;
}

Assistant:

Capturer::~Capturer() {
        if ( !uncaught_exceptions() ){
            assert( m_captured == m_messages.size() );
            for( size_t i = 0; i < m_captured; ++i  )
                m_resultCapture.popScopedMessage( m_messages[i] );
        }
    }